

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Clara::CommandLine<Catch::ConfigData>::Arg::dbgName_abi_cxx11_
          (string *__return_storage_ptr__,Arg *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *__lhs;
  allocator local_9;
  
  if ((this->longName)._M_string_length == 0) {
    __rhs = (this->shortNames).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (__rhs == (this->shortNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"positional args",&local_9);
      return __return_storage_ptr__;
    }
    __lhs = "-";
  }
  else {
    __rhs = &this->longName;
    __lhs = "--";
  }
  std::operator+(__return_storage_ptr__,__lhs,__rhs);
  return __return_storage_ptr__;
}

Assistant:

std::string dbgName() const {
                if( !longName.empty() )
                    return "--" + longName;
                if( !shortNames.empty() )
                    return "-" + shortNames[0];
                return "positional args";
            }